

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O1

void __thiscall
cmFindPathCommand::cmFindPathCommand
          (cmFindPathCommand *this,string *findCommandName,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (findCommandName->_M_dataplus)._M_p;
  paVar1 = &findCommandName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_38.field_2._8_8_ = *(undefined8 *)((long)&findCommandName->field_2 + 8);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38._M_string_length = findCommandName->_M_string_length;
  (findCommandName->_M_dataplus)._M_p = (pointer)paVar1;
  findCommandName->_M_string_length = 0;
  (findCommandName->field_2)._M_local_buf[0] = '\0';
  cmFindBase::cmFindBase(&this->super_cmFindBase,&local_38,status);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindBase_00963158;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).EnvironmentPath,0,
             (char *)(this->super_cmFindBase).EnvironmentPath._M_string_length,0x77f285);
  this->IncludeFileInPath = false;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).VariableDocumentation,0,
             (char *)(this->super_cmFindBase).VariableDocumentation._M_string_length,0x786bd9);
  (this->super_cmFindBase).VariableType = PATH;
  return;
}

Assistant:

cmFindPathCommand::cmFindPathCommand(std::string findCommandName,
                                     cmExecutionStatus& status)
  : cmFindBase(std::move(findCommandName), status)
{
  this->EnvironmentPath = "INCLUDE";
  this->IncludeFileInPath = false;
  this->VariableDocumentation = "Path to a file.";
  this->VariableType = cmStateEnums::PATH;
}